

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall unitOps_inequality1_Test::unitOps_inequality1_Test(unitOps_inequality1_Test *this)

{
  unitOps_inequality1_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__unitOps_inequality1_Test_0025c478;
  return;
}

Assistant:

TEST(unitOps, inequality1)
{
    int eqFailPos = 0;
    int eqFailNeg = 0;
    double start = 1.0;
    while (start < (1.0 + 2e-6)) {
        double diff = 1e-5;
        while (diff > 2.501e-6) {
            auto u1 = unit(start, V);
            auto u2 = unit(start + diff, V);
            auto u3 = unit(start - diff, V);
            if (u1 == u2) {
                ++eqFailPos;
            }
            if (u1 == u3) {
                ++eqFailNeg;
            }
            diff -= 1e-8;
        }
        start += 1e-9;
    }
    EXPECT_EQ(eqFailPos, 0);
    EXPECT_EQ(eqFailNeg, 0);
}